

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::TraceWriterImpl::~TraceWriterImpl(TraceWriterImpl *this)

{
  bool bVar1;
  pointer this_00;
  function<void_()> local_30;
  TraceWriterImpl *local_10;
  TraceWriterImpl *this_local;
  
  (this->super_TraceWriter).super_TraceWriterBase._vptr_TraceWriterBase =
       (_func_int **)&PTR__TraceWriterImpl_009c2578;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_009c25c0;
  local_10 = this;
  bVar1 = SharedMemoryABI::Chunk::is_valid(&this->cur_chunk_);
  if (bVar1) {
    this_00 = std::
              unique_ptr<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>,_std::default_delete<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_>_>
              ::operator->(&this->cur_packet_);
    protozero::Message::Finalize((Message *)this_00);
    ::std::function<void_()>::function(&local_30);
    (*(this->super_TraceWriter).super_TraceWriterBase._vptr_TraceWriterBase[3])(this,&local_30);
    ::std::function<void_()>::~function(&local_30);
  }
  SharedMemoryArbiterImpl::ReleaseWriterID(this->shmem_arbiter_,this->id_);
  PatchList::~PatchList(&this->patch_list_);
  std::
  unique_ptr<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>,_std::default_delete<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_>_>
  ::~unique_ptr(&this->cur_packet_);
  protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&this->protobuf_stream_writer_);
  protozero::ScatteredStreamWriter::Delegate::~Delegate(&this->super_Delegate);
  TraceWriter::~TraceWriter(&this->super_TraceWriter);
  return;
}

Assistant:

TraceWriterImpl::~TraceWriterImpl() {
  if (cur_chunk_.is_valid()) {
    cur_packet_->Finalize();
    Flush();
  }
  // This call may cause the shared memory arbiter (and the underlying memory)
  // to get asynchronously deleted if this was the last trace writer targeting
  // the arbiter and the arbiter was marked for shutdown.
  shmem_arbiter_->ReleaseWriterID(id_);
}